

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_arena.h
# Opt level: O1

void __thiscall
google::protobuf::internal::SerialArena::ReturnArrayMemory(SerialArena *this,void *p,size_t size)

{
  byte bVar1;
  CachedBlock **ppCVar2;
  uint8_t uVar3;
  ulong uVar4;
  CachedBlock **new_list;
  
  if (0xf < size) {
    uVar4 = 0x3f;
    if (size != 0) {
      for (; size >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar4 = (uVar4 ^ 0xffffffffffffffc0) + 0x3c;
    bVar1 = this->cached_block_length_;
    if (uVar4 < bVar1) {
      ppCVar2 = this->cached_blocks_;
      *(CachedBlock **)p = ppCVar2[uVar4];
      ppCVar2[uVar4] = (CachedBlock *)p;
    }
    else {
      uVar4 = size >> 3;
      if ((ulong)bVar1 != 0) {
        memmove(p,this->cached_blocks_,(ulong)bVar1 << 3);
      }
      bVar1 = this->cached_block_length_;
      if (uVar4 != bVar1) {
        memset((void *)((long)p + (ulong)bVar1 * 8),0,size + (ulong)bVar1 * -8 & 0xfffffffffffffff8)
        ;
      }
      this->cached_blocks_ = (CachedBlock **)p;
      uVar3 = '@';
      if (uVar4 < 0x40) {
        uVar3 = (uint8_t)uVar4;
      }
      this->cached_block_length_ = uVar3;
    }
    return;
  }
  protobuf_assumption_failed
            ("size >= 16",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
             ,0x9d);
}

Assistant:

void ReturnArrayMemory(void* p, size_t size) {
    // We only need to check for 32-bit platforms.
    // In 64-bit platforms the minimum allocation size from Repeated*Field will
    // be 16 guaranteed.
    if (sizeof(void*) < 8) {
      if (ABSL_PREDICT_FALSE(size < 16)) return;
    } else {
      PROTOBUF_ASSUME(size >= 16);
    }

    // We round down to the next smaller block in case the memory doesn't match
    // the pattern we are looking for. eg, someone might have called Reserve()
    // on the repeated field.
    const size_t index = absl::bit_width(size) - 5;

    if (ABSL_PREDICT_FALSE(index >= cached_block_length_)) {
      // We can't put this object on the freelist so make this object the
      // freelist. It is guaranteed it is larger than the one we have, and
      // large enough to hold another allocation of `size`.
      CachedBlock** new_list = static_cast<CachedBlock**>(p);
      size_t new_size = size / sizeof(CachedBlock*);

      std::copy(cached_blocks_, cached_blocks_ + cached_block_length_,
                new_list);

      // We need to unpoison this memory before filling it in case it has been
      // poisoned by another sanitizer client.
      internal::UnpoisonMemoryRegion(
          new_list + cached_block_length_,
          (new_size - cached_block_length_) * sizeof(CachedBlock*));

      std::fill(new_list + cached_block_length_, new_list + new_size, nullptr);

      cached_blocks_ = new_list;
      // Make the size fit in uint8_t. This is the power of two, so we don't
      // need anything larger.
      cached_block_length_ =
          static_cast<uint8_t>(std::min(size_t{64}, new_size));

      return;
    }

    auto& cached_head = cached_blocks_[index];
    auto* new_node = static_cast<CachedBlock*>(p);
    new_node->next = cached_head;
    cached_head = new_node;
    internal::PoisonMemoryRegion(p, size);
  }